

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset_intel_ich8.cc
# Opt level: O0

BiosCntl __thiscall security::pawn::IntelIch8Chipset::ReadBiosCntlRegister(IntelIch8Chipset *this)

{
  uint8_t bits;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  Pci *this_00;
  uint8_t bios_cntl;
  IntelIch8Chipset *this_local;
  
  this_00 = Chipset::pci(&this->super_Chipset);
  bits = Pci::ReadConfigUint8(this_00,0x8000f8dc);
  this_local._4_4_ = (BiosCntl)((uint)this_local._4_4_ & 0xfffffffe);
  bVar1 = pawn::bits::Test<4,unsigned_char>(bits);
  bVar2 = pawn::bits::Value<3,2,unsigned_char>(bits);
  bVar3 = pawn::bits::Test<1,unsigned_char>(bits);
  bVar4 = pawn::bits::Test<0,unsigned_char>(bits);
  this_local._4_4_ =
       (BiosCntl)
       CONCAT31(this_local._5_3_,
                this_local._4_1_ & 0xc1 | bVar1 << 1 | (bVar2 & 3) << 2 | bVar3 << 4 | bVar4 << 5);
  return this_local._4_4_;
}

Assistant:

Chipset::BiosCntl IntelIch8Chipset::ReadBiosCntlRegister() {
  auto bios_cntl = pci().ReadConfigUint8(kBiosCntlRegister);
  return {
      0,                         // Reserved, SMM_BWP on PCH platforms.
      bits::Test<4>(bios_cntl),  // TSS
      static_cast<Chipset::SpiReadConfiguration>(bits::Value<3, 2>(
          bios_cntl)),           // SRC, these bits map directly for ICH8.
      bits::Test<1>(bios_cntl),  // BLE
      bits::Test<0>(bios_cntl),  // BWE
  };
}